

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O2

Move * ddSiftingUp(DdManager *table,int y,int xLow)

{
  int y_00;
  int iVar1;
  DdHalfWord y_01;
  long lVar2;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  long lVar6;
  long lVar7;
  DdNode *pDVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int local_54;
  long local_40;
  
  lVar10 = (long)y;
  iVar9 = table->keys - table->isolated;
  y_00 = table->invperm[lVar10];
  lVar11 = (long)xLow;
  local_54 = iVar9;
  do {
    lVar6 = lVar11;
    lVar2 = lVar11 * 0xe + 4;
    do {
      lVar7 = lVar2;
      lVar11 = lVar6 + 1;
      if (lVar10 <= lVar11) {
        local_54 = (local_54 + (uint)(table->vars[y_00]->ref == 1)) - table->subtables[lVar10].keys;
        local_40 = lVar10 * 0xe + 4;
        pDVar8 = (DdNode *)0x0;
        goto LAB_0065eaa8;
      }
      iVar1 = table->invperm[lVar6 + 1];
      iVar3 = cuddTestInteract(table,iVar1,y_00);
      lVar6 = lVar11;
      lVar2 = lVar7 + 0xe;
    } while (iVar3 == 0);
    local_54 = (local_54 + (uint)(table->vars[iVar1]->ref == 1)) -
               *(int *)((long)&table->subtables[1].nodelist + lVar7 * 4);
  } while( true );
LAB_0065eaa8:
  if (lVar10 <= xLow) {
    return (Move *)pDVar8;
  }
  if (iVar9 < local_54) {
    return (Move *)pDVar8;
  }
  y_01 = (DdHalfWord)lVar10;
  iVar1 = table->invperm[lVar10 + -1];
  iVar3 = cuddSwapInPlace(table,y_01 - 1,y_01);
  if (iVar3 == 0) {
LAB_0065eb7e:
    while (pDVar8 != (DdNode *)0x0) {
      pDVar5 = (pDVar8->type).kids.T;
      pDVar8->ref = 0;
      pDVar8->next = table->nextFree;
      table->nextFree = pDVar8;
      pDVar8 = pDVar5;
    }
    return (Move *)0xffffffffffffffff;
  }
  iVar4 = cuddTestInteract(table,iVar1,y_00);
  if (iVar4 != 0) {
    local_54 = (local_54 - (uint)(table->vars[iVar1]->ref == 1)) +
               *(int *)((long)&table->subtables->nodelist + local_40 * 4);
  }
  pDVar5 = cuddDynamicAllocNode(table);
  if (pDVar5 == (DdNode *)0x0) goto LAB_0065eb7e;
  pDVar5->index = y_01 - 1;
  pDVar5->ref = y_01;
  *(int *)((long)&pDVar5->next + 4) = iVar3;
  (pDVar5->type).kids.T = pDVar8;
  if ((double)iVar9 * table->maxGrowth < (double)iVar3) {
    return (Move *)pDVar5;
  }
  if (iVar3 < iVar9) {
    iVar9 = iVar3;
  }
  local_40 = local_40 + -0xe;
  lVar10 = lVar10 + -1;
  pDVar8 = pDVar5;
  goto LAB_0065eaa8;
}

Assistant:

static Move *
ddSiftingUp(
  DdManager * table,
  int  y,
  int  xLow)
{
    Move        *moves;
    Move        *move;
    int         x;
    int         size;
    int         limitSize;
    int         xindex, yindex;
    int         isolated;
    int         L;      /* lower bound on DD size */
#ifdef DD_DEBUG
    int checkL;
    int z;
    int zindex;
#endif

    moves = NULL;
    yindex = table->invperm[y];

    /* Initialize the lower bound.
    ** The part of the DD below y will not change.
    ** The part of the DD above y that does not interact with y will not
    ** change. The rest may vanish in the best case, except for
    ** the nodes at level xLow, which will not vanish, regardless.
    */
    limitSize = L = table->keys - table->isolated;
    for (x = xLow + 1; x < y; x++) {
        xindex = table->invperm[x];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[xindex]->ref == 1;
            L -= table->subtables[x].keys - isolated;
        }
    }
    isolated = table->vars[yindex]->ref == 1;
    L -= table->subtables[y].keys - isolated;

    x = cuddNextLow(table,y);
    while (x >= xLow && L <= limitSize) {
        xindex = table->invperm[x];
#ifdef DD_DEBUG
        checkL = table->keys - table->isolated;
        for (z = xLow + 1; z < y; z++) {
            zindex = table->invperm[z];
            if (cuddTestInteract(table,zindex,yindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkL -= table->subtables[z].keys - isolated;
            }
        }
        isolated = table->vars[yindex]->ref == 1;
        checkL -= table->subtables[y].keys - isolated;
        assert(L == checkL);
#endif
        size = cuddSwapInPlace(table,x,y);
        if (size == 0) goto ddSiftingUpOutOfMem;
        /* Update the lower bound. */
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[xindex]->ref == 1;
            L += table->subtables[y].keys - isolated;
        }
        move = (Move *) cuddDynamicAllocNode(table);
        if (move == NULL) goto ddSiftingUpOutOfMem;
        move->x = x;
        move->y = y;
        move->size = size;
        move->next = moves;
        moves = move;
        if ((double) size > (double) limitSize * table->maxGrowth) break;
        if (size < limitSize) limitSize = size;
        y = x;
        x = cuddNextLow(table,y);
    }
    return(moves);

ddSiftingUpOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}